

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

QPainterPath __thiscall QPainterPath::united(QPainterPath *this,QPainterPath *p)

{
  QPainterPathPrivate *pQVar1;
  long lVar2;
  QPainterPathPrivate *pQVar3;
  QPainterPath *in_RDX;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (p->d_ptr).d.ptr;
  if (pQVar1 == (QPainterPathPrivate *)0x0) {
LAB_003e37f6:
    p = in_RDX;
  }
  else {
    lVar2 = (pQVar1->elements).d.size;
    if ((lVar2 == 1) && (((pQVar1->elements).d.ptr)->type == MoveToElement)) {
LAB_003e37ec:
      if (((pQVar1->elements).d.ptr)->type == MoveToElement) goto LAB_003e37f6;
    }
    else {
      pQVar3 = (in_RDX->d_ptr).d.ptr;
      if ((pQVar3 != (QPainterPathPrivate *)0x0) &&
         (((pQVar3->elements).d.size != 1 || (((pQVar3->elements).d.ptr)->type != MoveToElement))))
      {
        local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QPathClipper::QPathClipper((QPathClipper *)local_48,p,in_RDX);
        QPathClipper::clip((QPathClipper *)this,(Operation)local_48);
        ~QPainterPath((QPainterPath *)(local_48 + 8));
        ~QPainterPath((QPainterPath *)local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
                 (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
        }
        goto LAB_003e381e;
      }
      if (lVar2 == 1) goto LAB_003e37ec;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QPainterPath(this,p);
    return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
           (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
  }
LAB_003e381e:
  __stack_chk_fail();
}

Assistant:

QPainterPath QPainterPath::united(const QPainterPath &p) const
{
    if (isEmpty() || p.isEmpty())
        return isEmpty() ? p : *this;
    QPathClipper clipper(*this, p);
    return clipper.clip(QPathClipper::BoolOr);
}